

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::inverse(Chromosome *this,size_t ip1,size_t ip2)

{
  byte bVar1;
  bool bVar2;
  reference pbVar3;
  reference local_98 [2];
  reference local_78;
  reference local_68;
  reference local_58;
  byte local_41;
  long lStack_40;
  bool tmp;
  size_t ctr;
  size_t i;
  __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
  local_28;
  iterator it;
  size_t ip2_local;
  size_t ip1_local;
  Chromosome *this_local;
  
  it._M_current = (bitset<50UL> *)ip2;
  local_28._M_current =
       (bitset<50UL> *)
       std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::begin(&this->genes);
  while( true ) {
    i = (size_t)std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::end
                          (&this->genes);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
                        *)&i);
    ctr = ip1;
    if (!bVar2) break;
    for (; ctr < it._M_current; ctr = ctr + 1) {
      lStack_40 = ctr - ip1;
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
               ::operator*(&local_28);
      std::bitset<50UL>::operator[]((bitset<50UL> *)&local_58,(size_t)pbVar3);
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_58);
      std::bitset<50UL>::reference::~reference(&local_58);
      local_41 = bVar2;
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
               ::operator*(&local_28);
      std::bitset<50UL>::operator[]((bitset<50UL> *)&local_68,(size_t)pbVar3);
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
               ::operator*(&local_28);
      std::bitset<50UL>::operator[]((bitset<50UL> *)&local_78,(size_t)pbVar3);
      std::bitset<50UL>::reference::operator=(&local_78,&local_68);
      std::bitset<50UL>::reference::~reference(&local_78);
      std::bitset<50UL>::reference::~reference(&local_68);
      bVar1 = local_41;
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
               ::operator*(&local_28);
      std::bitset<50UL>::operator[]((bitset<50UL> *)local_98,(size_t)pbVar3);
      std::bitset<50UL>::reference::operator=(local_98,(bool)(bVar1 & 1));
      std::bitset<50UL>::reference::~reference(local_98);
    }
    __gnu_cxx::
    __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void Chromosome::inverse( size_t ip1, size_t ip2 )
{
	for(genes_t::iterator it = genes.begin(); it != genes.end(); ++it)
	{
		for(size_t i = ip1; i < ip2; ++i)
		{
			size_t ctr = i - ip1;

			bool tmp = (*it)[i];
			(*it)[i] = (*it)[ (ip2-1) - i];
			(*it)[ (ip2-1) - i] = tmp;
		}
	}
}